

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.h
# Opt level: O2

void __thiscall jsonnet::internal::TraceFrame::~TraceFrame(TraceFrame *this)

{
  std::__cxx11::string::~string((string *)&this->name);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

TraceFrame(const LocationRange &location, const std::string &name = "")
        : location(location), name(name)
    {
    }